

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<double[],_std::default_delete<double[]>_> __thiscall
qclab::dense::init_unique_array<double>(dense *this,int64_t size,double value)

{
  long lVar1;
  unique_ptr<double[],_std::default_delete<double[]>_> mem;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> local_20;
  
  alloc_unique_array<double>((dense *)&local_20,size);
  for (lVar1 = 0; size << 3 != lVar1; lVar1 = lVar1 + 8) {
    *(double *)
     ((long)local_20._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar1) = value;
  }
  *(tuple<double_*,_std::default_delete<double[]>_> *)this =
       local_20._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  local_20._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_20);
  return (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)this;
}

Assistant:

inline auto init_unique_array( const int64_t size , const T value ) {
      auto mem = alloc_unique_array< T >( size ) ;
      std::fill( mem.get() , mem.get() + size , value ) ;
      return mem ;
    }